

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_307f50::la_diagnostic(archive *ar,la_ssize_t r)

{
  ostream *poVar1;
  char *local_30;
  char *err;
  char *warn;
  la_ssize_t r_local;
  archive *ar_local;
  
  if (r < 0) {
    if (r < -0x14) {
      local_30 = archive_error_string(ar);
      if (local_30 == (char *)0x0) {
        local_30 = "unknown error";
      }
      poVar1 = std::operator<<((ostream *)&std::cerr,"cmake -E tar: error: ");
      poVar1 = std::operator<<(poVar1,local_30);
      std::operator<<(poVar1,'\n');
      ar_local._7_1_ = false;
    }
    else {
      err = archive_error_string(ar);
      if (err == (char *)0x0) {
        err = "unknown warning";
      }
      poVar1 = std::operator<<((ostream *)&std::cerr,"cmake -E tar: warning: ");
      poVar1 = std::operator<<(poVar1,err);
      std::operator<<(poVar1,'\n');
      ar_local._7_1_ = true;
    }
  }
  else {
    ar_local._7_1_ = true;
  }
  return ar_local._7_1_;
}

Assistant:

bool la_diagnostic(struct archive* ar, __LA_SSIZE_T r)
{
  // See archive.h definition of ARCHIVE_OK for return values.

  if (r >= ARCHIVE_OK) {
    return true;
  }

  if (r >= ARCHIVE_WARN) {
    const char* warn = archive_error_string(ar);
    if (!warn) {
      warn = "unknown warning";
    }
    std::cerr << "cmake -E tar: warning: " << warn << '\n';
    return true;
  }

  // Error.
  const char* err = archive_error_string(ar);
  if (!err) {
    err = "unknown error";
  }
  std::cerr << "cmake -E tar: error: " << err << '\n';
  return false;
}